

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

sftp_packet * sftp_recv(void)

{
  _Bool _Var1;
  sftp_packet *pkt;
  uint length;
  char x [4];
  uint local_c;
  
  _Var1 = sftp_recvdata((char *)&local_c,4);
  if ((_Var1) &&
     (length = local_c >> 0x18 | (local_c & 0xff0000) >> 8 | (local_c & 0xff00) << 8 |
               local_c << 0x18, length < 0x100001)) {
    pkt = sftp_recv_prepare(length);
    _Var1 = sftp_recvdata(pkt->data,pkt->length);
    if ((_Var1) && (_Var1 = sftp_recv_finish(pkt), _Var1)) {
      return pkt;
    }
    sftp_pkt_free(pkt);
  }
  return (sftp_packet *)0x0;
}

Assistant:

struct sftp_packet *sftp_recv(void)
{
    struct sftp_packet *pkt;
    char x[4];

    if (!sftp_recvdata(x, 4))
        return NULL;

    /* Impose _some_ upper bound on packet size. We never expect to
     * receive more than 32K of data in response to an FXP_READ,
     * because we decide how much data to ask for. FXP_READDIR and
     * pathname-returning things like FXP_REALPATH don't have an
     * explicit bound, so I suppose we just have to trust the server
     * to be sensible. */
    unsigned pktlen = GET_32BIT_MSB_FIRST(x);
    if (pktlen > (1<<20))
        return NULL;

    pkt = sftp_recv_prepare(pktlen);

    if (!sftp_recvdata(pkt->data, pkt->length)) {
        sftp_pkt_free(pkt);
        return NULL;
    }

    if (!sftp_recv_finish(pkt)) {
        sftp_pkt_free(pkt);
        return NULL;
    }

    return pkt;
}